

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

QWidget * __thiscall
QWidgetPrivate::determineLastFocusChild(QWidgetPrivate *this,QWidget *noFurtherThan)

{
  QWidget *pQVar1;
  long lVar2;
  long lVar3;
  QWidget *pQVar4;
  QWidget *pQVar5;
  QWidget *pQVar6;
  QWidget *pQVar7;
  long lVar8;
  QWidget *pQVar9;
  QWidget *pQVar10;
  
  pQVar1 = *(QWidget **)&this->field_0x8;
  pQVar4 = deepestFocusProxy(this);
  pQVar5 = pQVar4;
  if (pQVar4 == (QWidget *)0x0) {
    lVar2 = *(long *)(*(long *)&pQVar1->field_0x8 + 0x28);
    if (lVar2 == 0) {
      return pQVar1;
    }
    lVar8 = 0;
    do {
      pQVar5 = *(QWidget **)(*(long *)(*(long *)&pQVar1->field_0x8 + 0x20) + lVar8);
      if ((pQVar5 != (QWidget *)0x0) && ((*(byte *)(*(long *)&pQVar5->field_0x8 + 0x30) & 1) != 0))
      {
        lVar3 = *(long *)(*(long *)&pQVar5->field_0x8 + 0x78);
        if ((lVar3 == 0) ||
           ((*(long *)(lVar3 + 0x30) == 0 || (*(int *)(*(long *)(lVar3 + 0x30) + 4) == 0)))) {
          pQVar4 = (QWidget *)0x0;
        }
        else {
          pQVar4 = *(QWidget **)(lVar3 + 0x38);
        }
        if (pQVar4 == pQVar1) {
          return pQVar5;
        }
      }
      lVar8 = lVar8 + 8;
      if (lVar2 << 3 == lVar8) {
        return pQVar1;
      }
    } while( true );
  }
  while (pQVar5 != pQVar1) {
    if (((pQVar5->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      return pQVar1;
    }
    pQVar5 = *(QWidget **)(*(long *)&pQVar5->field_0x8 + 0x10);
    if (pQVar5 == (QWidget *)0x0) {
      return pQVar1;
    }
  }
  pQVar5 = *(QWidget **)(*(long *)(*(long *)(*(long *)&pQVar4->field_0x8 + 8) + 8) + 0x80);
  pQVar7 = pQVar5;
  pQVar6 = pQVar4;
  if (pQVar5 == (QWidget *)0x0 || pQVar5 == pQVar4) {
    return pQVar4;
  }
  do {
    pQVar10 = pQVar7;
    if (pQVar5 == pQVar1) {
      do {
        pQVar9 = pQVar10;
        pQVar10 = *(QWidget **)(*(long *)&pQVar9->field_0x8 + 0x10);
        pQVar5 = pQVar4;
        if (pQVar10 == (QWidget *)0x0) break;
      } while (((pQVar9->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
      do {
        pQVar10 = pQVar5;
        pQVar5 = *(QWidget **)(*(long *)&pQVar10->field_0x8 + 0x10);
        if (pQVar5 == (QWidget *)0x0) break;
      } while (((pQVar10->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
      if (pQVar7 == noFurtherThan) {
        return pQVar6;
      }
      if (pQVar9 != pQVar10) {
        return pQVar6;
      }
      if ((pQVar7->data->field_0x10 & 0xf0) != 0) {
        pQVar6 = pQVar7;
      }
      pQVar5 = *(QWidget **)(*(long *)(*(long *)(*(long *)&pQVar7->field_0x8 + 8) + 8) + 0x80);
      pQVar7 = pQVar5;
      if (pQVar5 == pQVar4) {
        return pQVar6;
      }
    }
    else {
      if (((pQVar5->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
        return pQVar6;
      }
      pQVar5 = *(QWidget **)(*(long *)&pQVar5->field_0x8 + 0x10);
    }
    if (pQVar5 == (QWidget *)0x0) {
      return pQVar6;
    }
  } while( true );
}

Assistant:

QWidget *QWidgetPrivate::determineLastFocusChild(QWidget *noFurtherThan)
{
    Q_Q(QWidget);
    // Since we need to repeat the same logic for both 'first' and 'second', we add a function
    // that determines the last focus child for a widget, taking proxies and compound widgets into
    // account. If the target is not a compound widget (it doesn't have a focus proxy that points
    // to a child), 'lastFocusChild' will be set to the target itself.
    QWidget *lastFocusChild = q;

    QWidget *focusProxy = deepestFocusProxy();
    if (!focusProxy) {
        // QTBUG-81097: Another case is possible here. We can have a child
        // widget, that sets its focusProxy() to the parent (target).
        // An example of such widget is a QLineEdit, nested into
        // a QAbstractSpinBox. In this case such widget should be considered
        // the last focus child.
        for (auto *object : std::as_const(q->children())) {
            QWidget *w = qobject_cast<QWidget *>(object);
            if (w && w->focusProxy() == q) {
                lastFocusChild = w;
                break;
            }
        }
    } else if (q->isAncestorOf(focusProxy)) {
        lastFocusChild = focusProxy;
        for (QWidget *focusNext = lastFocusChild->nextInFocusChain();
             focusNext != focusProxy && q->isAncestorOf(focusNext)
                          && focusNext->window() == focusProxy->window();
             focusNext = focusNext->nextInFocusChain()) {
            if (focusNext == noFurtherThan)
                break;
            if (focusNext->focusPolicy() != Qt::NoFocus)
                lastFocusChild = focusNext;
        }
    }
    return lastFocusChild;
}